

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motd.cpp
# Opt level: O1

void __thiscall CMotd::OnRender(CMotd *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  vec2 vVar5;
  int64 iVar6;
  long in_FS_OFFSET;
  float fVar7;
  vec4 local_48;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_30;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_2c;
  float fStack_28;
  undefined4 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_CComponent).m_pClient)->m_pMenus->m_MenuActive == false) {
    iVar6 = time_get();
    if (iVar6 < this->m_ServerMotdTime) {
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      uVar1 = pIVar3->m_ScreenWidth;
      uVar2 = pIVar3->m_ScreenHeight;
      fVar7 = ((float)(int)uVar1 / (float)(int)uVar2) * 1200.0;
      (*(pIVar3->super_IInterface)._vptr_IInterface[5])(0,0,fVar7);
      local_30.x = fVar7 * 0.5 + -325.0;
      aStack_2c.y = 150.0;
      fStack_28 = 650.0;
      local_24 = 0x444c8000;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])()
      ;
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
      local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
      local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
      CUIRect::Draw((CUIRect *)&local_30,&local_48,30.0,0xf);
      CUIRect::Margin((CUIRect *)&local_30,25.0,(CUIRect *)&local_30);
      (this->m_ServerMotdCursor).m_Flags = 0xe;
      (this->m_ServerMotdCursor).m_FontSize = 32.0;
      (this->m_ServerMotdCursor).m_MaxWidth = fStack_28;
      (this->m_ServerMotdCursor).m_MaxLines = 0x18;
      CTextCursor::Reset(&this->m_ServerMotdCursor,this->m_ServerMotdTime);
      vVar5.field_1 = aStack_2c;
      vVar5.field_0.x = local_30.x;
      (this->m_ServerMotdCursor).m_CursorPos = vVar5;
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&this->m_ServerMotdCursor,this->m_aServerMotd,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMotd::OnRender()
{
	if(!IsActive())
		return;

	const float Height = 400.0f * 3.0f;
	const float Width = Height * Graphics()->ScreenAspect();

	Graphics()->MapScreen(0, 0, Width, Height);

	const int MaxLines = 24;
	const float TextSize = 32.0f;

	float h = MaxLines * TextSize + 2 * 25.0f;
	float w = 650.0f;
	float x = Width/2 - w/2;
	float y = 150.0f;
	CUIRect Rect = {x, y, w, h};

	Graphics()->BlendNormal();
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.5f), 30.0f);

	Rect.Margin(25.0f, &Rect);

	m_ServerMotdCursor.m_Flags = TEXTFLAG_ALLOW_NEWLINE | TEXTFLAG_WORD_WRAP | TEXTFLAG_ELLIPSIS;
	m_ServerMotdCursor.m_FontSize = TextSize;
	m_ServerMotdCursor.m_MaxWidth = Rect.w;
	m_ServerMotdCursor.m_MaxLines = MaxLines;

	m_ServerMotdCursor.Reset(m_ServerMotdTime);
	m_ServerMotdCursor.MoveTo(Rect.x, Rect.y);
	TextRender()->TextOutlined(&m_ServerMotdCursor, m_aServerMotd, -1);
}